

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoint.cpp
# Opt level: O3

void __thiscall Liby::Endpoint::Endpoint(Endpoint *this,string *addr,string *port)

{
  int iVar1;
  char *__nptr;
  char *in_RAX;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *local_38;
  
  __nptr = (port->_M_dataplus)._M_p;
  local_38 = in_RAX;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    Endpoint(this,addr,(uint16_t)lVar3);
    return;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  _Unwind_Resume(uVar4);
}

Assistant:

Endpoint::Endpoint(const std::string &addr, const std::string &port)
    : Endpoint(addr, static_cast<uint16_t>(std::stoi(port))) {}